

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O0

fio_str_info_s *
fiobj_data_read2ch_file(fio_str_info_s *__return_storage_ptr__,FIOBJ io,uint8_t token)

{
  int iVar1;
  uint8_t *limit;
  ssize_t sVar2;
  int *piVar3;
  size_t sVar4;
  char *local_60;
  uintptr_t delta_1;
  ssize_t tmp;
  uintptr_t delta;
  uint8_t *lim;
  uint8_t *pos;
  FIOBJ FStack_10;
  uint8_t token_local;
  FIOBJ io_local;
  
  lim = (uint8_t *)(*(long *)(io + 8) + *(long *)(io + 0x28));
  limit = (uint8_t *)(*(long *)(io + 8) + *(long *)(io + 0x20));
  pos._7_1_ = token;
  FStack_10 = io;
  if ((lim == limit) || (iVar1 = swallow_ch(&lim,limit,token), iVar1 == 0)) {
    *(undefined8 *)(FStack_10 + 0x28) = 0;
    *(undefined8 *)(FStack_10 + 0x20) = 0;
    do {
      fiobj_data_pre_write(FStack_10,0x1000);
      do {
        sVar2 = pread(*(int *)(FStack_10 + 0x30),
                      (void *)(*(long *)(FStack_10 + 8) + *(long *)(FStack_10 + 0x20)),0x1000,
                      *(long *)(FStack_10 + 0x10) + *(long *)(FStack_10 + 0x20));
        if (-1 < sVar2) break;
        piVar3 = __errno_location();
      } while (*piVar3 == 4);
      if ((sVar2 < 0) || ((sVar2 == 0 && (*(long *)(FStack_10 + 0x20) == 0)))) {
        memset(__return_storage_ptr__,0,0x18);
        return __return_storage_ptr__;
      }
      if (sVar2 == 0) {
        *(long *)(FStack_10 + 0x10) = *(long *)(FStack_10 + 0x20) + *(long *)(FStack_10 + 0x10);
        __return_storage_ptr__->capa = 0;
        __return_storage_ptr__->len = *(size_t *)(FStack_10 + 0x20);
        __return_storage_ptr__->data = *(char **)(FStack_10 + 8);
        return __return_storage_ptr__;
      }
      *(ssize_t *)(FStack_10 + 0x20) = sVar2 + *(long *)(FStack_10 + 0x20);
      lim = *(uint8_t **)(FStack_10 + 8);
      iVar1 = swallow_ch(&lim,(uint8_t *)(*(long *)(FStack_10 + 8) + *(long *)(FStack_10 + 0x20)),
                         pos._7_1_);
    } while (iVar1 == 0);
    sVar4 = (long)lim - (*(long *)(FStack_10 + 8) + *(long *)(FStack_10 + 0x28));
    *(size_t *)(FStack_10 + 0x28) = sVar4;
    *(size_t *)(FStack_10 + 0x10) = sVar4 + *(long *)(FStack_10 + 0x10);
    __return_storage_ptr__->capa = 0;
    __return_storage_ptr__->len = sVar4;
    __return_storage_ptr__->data = *(char **)(FStack_10 + 8);
  }
  else {
    sVar4 = (long)lim - (*(long *)(FStack_10 + 8) + *(long *)(FStack_10 + 0x28));
    *(size_t *)(FStack_10 + 0x28) = sVar4 + *(long *)(FStack_10 + 0x28);
    *(size_t *)(FStack_10 + 0x10) = sVar4 + *(long *)(FStack_10 + 0x10);
    __return_storage_ptr__->capa = 0;
    __return_storage_ptr__->len = sVar4;
    if (sVar4 == 0) {
      local_60 = (char *)0x0;
    }
    else {
      local_60 = (char *)((*(long *)(FStack_10 + 8) + *(long *)(FStack_10 + 0x28)) - sVar4);
    }
    __return_storage_ptr__->data = local_60;
  }
  return __return_storage_ptr__;
}

Assistant:

static fio_str_info_s fiobj_data_read2ch_file(FIOBJ io, uint8_t token) {
  uint8_t *pos = obj2io(io)->buffer + obj2io(io)->pos;
  uint8_t *lim = obj2io(io)->buffer + obj2io(io)->len;
  if (pos != lim && swallow_ch(&pos, lim, token)) {
    /* newline found in existing buffer */
    const uintptr_t delta =
        (uintptr_t)(pos - (obj2io(io)->buffer + obj2io(io)->pos));
    obj2io(io)->pos += delta;
    obj2io(io)->source.fpos += delta;
    return (fio_str_info_s){
        .data =
            (char *)(delta ? ((obj2io(io)->buffer + obj2io(io)->pos) - delta)
                           : NULL),
        .len = delta,
    };
  }

  obj2io(io)->pos = 0;
  obj2io(io)->len = 0;

  while (1) {
    ssize_t tmp;
    fiobj_data_pre_write(io, 4096); /* read a page at a time */
  retry_int:
    tmp = pread(obj2io(io)->fd, obj2io(io)->buffer + obj2io(io)->len, 4096,
                obj2io(io)->source.fpos + obj2io(io)->len);
    if (tmp < 0 && errno == EINTR)
      goto retry_int;
    if (tmp < 0 || (tmp == 0 && obj2io(io)->len == 0)) {
      return (fio_str_info_s){.data = NULL, .len = 0};
    }
    if (tmp == 0) {
      obj2io(io)->source.fpos += obj2io(io)->len;
      return (fio_str_info_s){.data = (char *)obj2io(io)->buffer,
                              .len = obj2io(io)->len};
    }
    obj2io(io)->len += tmp;
    pos = obj2io(io)->buffer;
    lim = obj2io(io)->buffer + obj2io(io)->len;
    if (swallow_ch(&pos, lim, token)) {
      const uintptr_t delta =
          (uintptr_t)(pos - (obj2io(io)->buffer + obj2io(io)->pos));
      obj2io(io)->pos = delta;
      obj2io(io)->source.fpos += delta;
      return (fio_str_info_s){
          .data = (char *)obj2io(io)->buffer,
          .len = delta,
      };
    }
  }
}